

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_plt_qua_zone(REF_GRID ref_grid,REF_INT id,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  double dVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  FILE *pFVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  double *pdVar10;
  REF_CELL ref_cell;
  int iVar11;
  long lVar12;
  char *pcVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double maxdata;
  double mindata;
  REF_GLOB *l2c;
  double tempdata;
  int dataformat;
  int connsharing;
  int varsharing;
  int passive;
  float zonemarker;
  REF_GLOB nnode;
  REF_LONG ncell;
  double local_b8;
  double local_b0;
  REF_GLOB *local_a8;
  double local_a0;
  int local_94;
  ulong local_90;
  FILE *local_88;
  REF_CELL local_80;
  REF_INT local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  ulong local_60;
  double *local_58;
  long local_50;
  long local_48;
  ulong local_40;
  double *local_38;
  
  uVar6 = (ulong)(uint)ldim;
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[6];
  local_64 = 0x43958000;
  local_94 = 2;
  local_68 = 0;
  local_6c = 0;
  local_70 = 0xffffffff;
  local_88 = (FILE *)file;
  local_58 = scalar;
  uVar3 = ref_grid_compact_cell_id_nodes(ref_grid,ref_cell,id,&local_50,&local_48,&local_a8);
  pFVar2 = local_88;
  if (uVar3 == 0) {
    local_90 = uVar6;
    if ((local_50 < 1) || (local_48 < 1)) {
LAB_0014cd33:
      if (local_a8 == (REF_GLOB *)0x0) {
        return 0;
      }
      free(local_a8);
      return 0;
    }
    if (ref_mpi->id == 0) {
      sVar5 = fwrite(&local_64,4,1,local_88);
      if (sVar5 != 1) {
        pcVar13 = "zonemarker";
        uVar8 = 4000;
LAB_0014cdf5:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar8,"ref_gather_plt_qua_zone",pcVar13,1,sVar5);
        return 1;
      }
      local_80 = ref_cell;
      if (-3 < (int)local_90) {
        iVar4 = (int)local_90 + 2;
        iVar11 = 0;
        if (0 < iVar4) {
          iVar11 = iVar4;
        }
        iVar11 = iVar11 + 1;
        do {
          sVar5 = fwrite(&local_94,4,1,pFVar2);
          if (sVar5 != 1) {
            pcVar13 = "int";
            uVar8 = 0xfa3;
            goto LAB_0014cdf5;
          }
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      sVar5 = fwrite(&local_68,4,1,pFVar2);
      if (sVar5 != 1) {
        pcVar13 = "int";
        uVar8 = 0xfa6;
        goto LAB_0014cdf5;
      }
      sVar5 = fwrite(&local_6c,4,1,pFVar2);
      if (sVar5 != 1) {
        pcVar13 = "int";
        uVar8 = 0xfa7;
        goto LAB_0014cdf5;
      }
      sVar5 = fwrite(&local_70,4,1,pFVar2);
      ref_cell = local_80;
      if (sVar5 != 1) {
        pcVar13 = "int";
        uVar8 = 0xfa8;
        goto LAB_0014cdf5;
      }
    }
    lVar16 = 0;
    lVar15 = 0;
    local_80 = ref_cell;
    local_74 = id;
    do {
      local_b0 = 1e+200;
      local_b8 = -1e+200;
      local_a0 = 1e+200;
      if (0 < (long)ref_node->max) {
        lVar12 = 0;
        local_a0 = 1e+200;
        dVar17 = -1e+200;
        lVar9 = lVar16;
        do {
          if ((local_a8[lVar12] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar12])) {
            dVar1 = *(double *)((long)ref_node->real + lVar9);
            if (dVar1 <= local_a0) {
              local_a0 = dVar1;
            }
            dVar1 = *(double *)((long)ref_node->real + lVar9);
            local_b8 = dVar17;
            local_b0 = local_a0;
            if (dVar17 <= dVar1) {
              dVar17 = dVar1;
              local_b8 = dVar1;
            }
          }
          lVar12 = lVar12 + 1;
          lVar9 = lVar9 + 0x78;
        } while (ref_node->max != lVar12);
      }
      uVar3 = ref_mpi_min(ref_mpi,&local_a0,&local_b0,3);
      if (uVar3 != 0) {
        pcVar13 = "mpi min";
        uVar8 = 0xfb5;
        goto LAB_0014c6f2;
      }
      local_a0 = local_b8;
      uVar3 = ref_mpi_max(ref_mpi,&local_a0,&local_b8,3);
      pFVar2 = local_88;
      if (uVar3 != 0) {
        pcVar13 = "mpi max";
        uVar8 = 0xfb7;
        goto LAB_0014c6f2;
      }
      if (ref_mpi->id == 0) {
        sVar5 = fwrite(&local_b0,8,1,local_88);
        if (sVar5 != 1) {
          pcVar13 = "mindata";
          uVar8 = 0xfb9;
          goto LAB_0014cdf5;
        }
        sVar5 = fwrite(&local_b8,8,1,pFVar2);
        if (sVar5 != 1) {
          pcVar13 = "maxdata";
          uVar8 = 0xfba;
          goto LAB_0014cdf5;
        }
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 8;
    } while (lVar15 != 3);
    if (0 < (int)local_90) {
      uVar6 = local_90 & 0xffffffff;
      uVar7 = 0;
      pdVar14 = local_58;
      local_40 = uVar6;
      do {
        local_b0 = 1e+200;
        local_b8 = -1e+200;
        local_a0 = 1e+200;
        if (0 < (long)ref_node->max) {
          lVar15 = 0;
          local_a0 = 1e+200;
          dVar17 = -1e+200;
          pdVar10 = pdVar14;
          do {
            if ((local_a8[lVar15] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar15])) {
              dVar1 = *pdVar10;
              if (dVar1 <= local_a0) {
                local_a0 = dVar1;
              }
              local_b8 = dVar17;
              local_b0 = local_a0;
              if (dVar17 <= dVar1) {
                dVar17 = dVar1;
                local_b8 = dVar1;
              }
            }
            lVar15 = lVar15 + 1;
            pdVar10 = pdVar10 + uVar6;
          } while (ref_node->max != lVar15);
        }
        local_60 = uVar7;
        local_38 = pdVar14;
        uVar3 = ref_mpi_min(ref_mpi,&local_a0,&local_b0,3);
        if (uVar3 != 0) {
          pcVar13 = "mpi min";
          uVar8 = 0xfc7;
          goto LAB_0014c6f2;
        }
        local_a0 = local_b8;
        uVar3 = ref_mpi_max(ref_mpi,&local_a0,&local_b8,3);
        pFVar2 = local_88;
        if (uVar3 != 0) {
          pcVar13 = "mpi max";
          uVar8 = 0xfc9;
          goto LAB_0014c6f2;
        }
        if (ref_mpi->id == 0) {
          sVar5 = fwrite(&local_b0,8,1,local_88);
          if (sVar5 != 1) {
            pcVar13 = "mindata";
            uVar8 = 0xfcb;
            goto LAB_0014cdf5;
          }
          sVar5 = fwrite(&local_b8,8,1,pFVar2);
          if (sVar5 != 1) {
            pcVar13 = "maxdata";
            uVar8 = 0xfcc;
            goto LAB_0014cdf5;
          }
        }
        uVar7 = local_60 + 1;
        pdVar14 = local_38 + 1;
      } while (uVar7 != local_40);
    }
    pFVar2 = local_88;
    uVar3 = ref_gather_node_tec_block
                      (ref_node,local_50,local_a8,(REF_INT)local_90,local_58,local_94,
                       (FILE *)local_88);
    if (uVar3 == 0) {
      uVar3 = ref_gather_cell_id_tec(ref_node,local_80,local_74,local_48,local_a8,1,(FILE *)pFVar2);
      if (uVar3 == 0) goto LAB_0014cd33;
      pcVar13 = "c2n";
      uVar8 = 0xfd6;
    }
    else {
      pcVar13 = "block points";
      uVar8 = 0xfd2;
    }
  }
  else {
    pcVar13 = "l2c";
    uVar8 = 0xf99;
  }
LAB_0014c6f2:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar8,
         "ref_gather_plt_qua_zone",(ulong)uVar3,pcVar13);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_qua_zone(REF_GRID ref_grid, REF_INT id,
                                                  REF_INT ldim, REF_DBL *scalar,
                                                  FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_qua(ref_grid);
  float zonemarker = 299.0;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int dataformat = 2; /*1=Float, 2=Double*/
  int passive = 0;
  int varsharing = 0;
  int connsharing = -1;
  double mindata, maxdata, tempdata;
  REF_INT node, ixyz, i;

  RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, id, &nnode, &ncell,
                                     &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    for (i = 0; i < 3 + ldim; i++) {
      REIS(1, fwrite(&dataformat, sizeof(int), 1, file), "int");
    }

    REIS(1, fwrite(&passive, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varsharing, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&connsharing, sizeof(int), 1, file), "int");
  }

  for (ixyz = 0; ixyz < 3; ixyz++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, ref_node_xyz(ref_node, ixyz, node));
        maxdata = MAX(maxdata, ref_node_xyz(ref_node, ixyz, node));
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  for (i = 0; i < ldim; i++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, scalar[i + ldim * node]);
        maxdata = MAX(maxdata, scalar[i + ldim * node]);
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }

  RSS(ref_gather_node_tec_block(ref_node, nnode, l2c, ldim, scalar, dataformat,
                                file),
      "block points");

  RSS(ref_gather_cell_id_tec(ref_node, ref_cell, id, ncell, l2c, REF_TRUE,
                             file),
      "c2n");

  ref_free(l2c);
  return REF_SUCCESS;
}